

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

HTS_Boolean HTS_is_num(char *buff)

{
  size_t sVar1;
  ushort **ppuVar2;
  size_t sVar3;
  
  sVar1 = strlen(buff);
  if (sVar1 != 0) {
    ppuVar2 = __ctype_b_loc();
    sVar3 = 0;
    do {
      if (((long)buff[sVar3] != 0x2d) && (((*ppuVar2)[buff[sVar3]] & 0x800) == 0)) {
        return '\0';
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return '\x01';
}

Assistant:

static HTS_Boolean HTS_is_num(const char *buff)
{
   size_t i;
   size_t length = strlen(buff);

   for (i = 0; i < length; i++)
      if (!(isdigit((int) buff[i]) || (buff[i] == '-')))
         return FALSE;

   return TRUE;
}